

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void output(string *outputFile)

{
  FILE *__s;
  size_t __size;
  long lVar1;
  int *piVar2;
  string sStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __s = fopen((outputFile->_M_dataplus)._M_p,"w");
  std::__cxx11::to_string(&sStack_68,ansNum);
  std::operator+(&local_48,&sStack_68,"\n");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&sStack_68);
  __size = strlen(local_48._M_dataplus._M_p);
  fwrite(local_48._M_dataplus._M_p,__size,1,__s);
  piVar2 = cycleNum + 3;
  for (lVar1 = 0; lVar1 != 0x28; lVar1 = lVar1 + 8) {
    fwrite(*(void **)((long)cycle + lVar1),(long)*piVar2,1,__s);
    piVar2 = piVar2 + 1;
  }
  fclose(__s);
  return;
}

Assistant:

void run() {
    int path[16];
    for (int i = 0; i < nodeNum; ++i) {
        if (outDegrees[i] < 1 || inDegrees[i] < 1)continue;
        dfs_range1(i, i, 1);
        dfs_range2(i, i, 1);
        dfs(i, i, 1, path);
    }
}